

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O2

void duckdb::Leaf::MergeInlined(ART *art,Node *l_node,Node *r_node)

{
  Allocator *allocator;
  ARTKey key;
  ArenaAllocator arena_allocator;
  ARTKey local_78;
  ArenaAllocator local_68;
  
  allocator = Allocator::Get((art->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&local_68,allocator,0x800);
  local_78 = ARTKey::CreateARTKey<long>
                       (&local_68,(r_node->super_IndexPointer).data & 0xffffffffffffff);
  ART::Insert(art,l_node,&local_78,0,&local_78,
              (GateStatus)((l_node->super_IndexPointer).data >> 0x3f),
              (optional_ptr<duckdb::ART,_true>)0x0,DEFAULT);
  (r_node->super_IndexPointer).data = 0;
  ArenaAllocator::~ArenaAllocator(&local_68);
  return;
}

Assistant:

void Leaf::MergeInlined(ART &art, Node &l_node, Node &r_node) {
	D_ASSERT(r_node.GetType() == INLINED);

	ArenaAllocator arena_allocator(Allocator::Get(art.db));
	auto key = ARTKey::CreateARTKey<row_t>(arena_allocator, r_node.GetRowId());
	art.Insert(l_node, key, 0, key, l_node.GetGateStatus(), nullptr, IndexAppendMode::DEFAULT);
	r_node.Clear();
}